

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

void __thiscall QFSFileEnginePrivate::unmapAll(QFSFileEnginePrivate *this)

{
  Data *pDVar1;
  int i;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<unsigned_char_*> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->maps).d;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (uchar **)&DAT_aaaaaaaaaaaaaaaa;
    QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::keys
              ((QList<unsigned_char_*> *)&local_38,&this->maps);
    for (puVar2 = (undefined1 *)0x0; puVar2 < (ulong)local_38.size; puVar2 = puVar2 + 1) {
      unmap(this,local_38.ptr[(long)puVar2]);
    }
    QArrayDataPointer<unsigned_char_*>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFSFileEnginePrivate::unmapAll()
{
    if (!maps.isEmpty()) {
        const QList<uchar*> keys = maps.keys(); // Make a copy since unmap() modifies the map.
        for (int i = 0; i < keys.size(); ++i)
            unmap(keys.at(i));
    }
}